

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Model::set_allocated_supportvectorclassifier
          (Model *this,SupportVectorClassifier *supportvectorclassifier)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (supportvectorclassifier != (SupportVectorClassifier *)0x0) {
    uVar1 = (supportvectorclassifier->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      supportvectorclassifier =
           (SupportVectorClassifier *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&supportvectorclassifier->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x191;
    (this->Type_).supportvectorclassifier_ = supportvectorclassifier;
  }
  return;
}

Assistant:

void Model::set_allocated_supportvectorclassifier(::CoreML::Specification::SupportVectorClassifier* supportvectorclassifier) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (supportvectorclassifier) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(supportvectorclassifier));
    if (message_arena != submessage_arena) {
      supportvectorclassifier = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, supportvectorclassifier, submessage_arena);
    }
    set_has_supportvectorclassifier();
    Type_.supportvectorclassifier_ = supportvectorclassifier;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.supportVectorClassifier)
}